

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O2

void test_read_at_least_second_read_in_callback(void)

{
  cio_buffered_stream *buffered_stream;
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  char chunk2_buf [6];
  cio_read_buffer rb;
  uint8_t buffer [100];
  uint8_t local_34 [12];
  
  ms = (memory_stream *)malloc(0x100);
  builtin_strncpy(chunk2_buf,"World",6);
  iVar1 = memory_stream_init(ms,"HelloWorld");
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x308,UNITY_DISPLAY_STYLE_INT);
  read_some_fake.custom_fake = read_some_max;
  dummy_read_handler_fake.custom_fake = save_to_check_buffer_and_read_at_least_again;
  second_dummy_read_handler_fake.custom_fake = save_to_second_check_buffer;
  rb.data = buffer;
  rb.end = local_34;
  rb.add_ptr = rb.data;
  rb.fetch_ptr = rb.data;
  UnityAssertEqualNumber
            (0,0,"Read buffer was not initialized correctly!",0x310,UNITY_DISPLAY_STYLE_INT);
  buffered_stream = (cio_buffered_stream *)(ms + 1);
  cVar2 = cio_buffered_stream_init(buffered_stream,(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x313,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_read_at_least(buffered_stream,&rb,5,dummy_read_handler,chunk2_buf);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x315,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x317,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_read_handler_fake.arg2_val,"Handler was not called with CIO_SUCCESS!",
             0x318,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&rb,(UNITY_INT)dummy_read_handler_fake.arg3_val,
             "Handler was not called with original read buffer!",0x319,UNITY_DISPLAY_STYLE_INT);
  iVar1 = bcmp(first_check_buffer,"Hello",5);
  if (iVar1 != 0) {
    UnityFail("Handler was not called with correct data!",0x31a);
  }
  UnityAssertEqualNumber
            (1,(ulong)second_dummy_read_handler_fake.call_count,"Handler was not called!",0x31c,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)second_dummy_read_handler_fake.arg2_val,
             "Handler was not called with CIO_SUCCESS!",0x31d,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&rb,(UNITY_INT)second_dummy_read_handler_fake.arg3_val,
             "Handler was not called with original read buffer!",0x31e,UNITY_DISPLAY_STYLE_INT);
  iVar1 = bcmp(second_check_buffer,"World",5);
  if (iVar1 == 0) {
    cVar2 = cio_buffered_stream_close(buffered_stream);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Return value of close not correct!",0x322,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x323,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("Handler was not called with correct data!",799);
}

Assistant:

static void test_read_at_least_second_read_in_callback(void)
{
	struct client *client = malloc(sizeof(*client));

	char chunk2_buf[] = CHUNK2;
	static const char *test_data = CHUNK1 CHUNK2;
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, test_data), "Could not allocate memory for test!");
	read_some_fake.custom_fake = read_some_max;
	dummy_read_handler_fake.custom_fake = save_to_check_buffer_and_read_at_least_again;
	second_dummy_read_handler_fake.custom_fake = save_to_second_check_buffer;

	uint8_t buffer[100];
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_read_at_least(&client->bs, &rb, strlen(CHUNK1), dummy_read_handler, chunk2_buf);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_read_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_read_handler_fake.arg2_val, "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, dummy_read_handler_fake.arg3_val, "Handler was not called with original read buffer!");
	TEST_ASSERT_MESSAGE(memcmp((const char *)first_check_buffer, CHUNK1, strlen(CHUNK1)) == 0, "Handler was not called with correct data!");

	TEST_ASSERT_EQUAL_MESSAGE(1, second_dummy_read_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, second_dummy_read_handler_fake.arg2_val, "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, second_dummy_read_handler_fake.arg3_val, "Handler was not called with original read buffer!");
	TEST_ASSERT_MESSAGE(memcmp((const char *)second_check_buffer, CHUNK2, strlen(CHUNK2)) == 0, "Handler was not called with correct data!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value of close not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
}